

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  char *description;
  DrawTestSpec spec;
  DrawTestSpec local_60;
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_60,baseSpec);
  if (type == TYPE_INSTANCE_COUNT) {
    local_60.instanceCount = 1;
    deqp::gls::DrawTest::addIteration(test,&local_60,"instance count = 1");
    local_60.instanceCount = 4;
    deqp::gls::DrawTest::addIteration(test,&local_60,"instance count = 4");
    local_60.instanceCount = 0xb;
    description = "instance count = 11";
  }
  else if (type == TYPE_DRAW_COUNT) {
    local_60.primitiveCount = 1;
    deqp::gls::DrawTest::addIteration(test,&local_60,"draw count = 1");
    local_60.primitiveCount = 5;
    deqp::gls::DrawTest::addIteration(test,&local_60,"draw count = 5");
    local_60.primitiveCount = 0x19;
    description = "draw count = 25";
  }
  else {
    local_60.indexMin = 0;
    local_60.indexMax = 0x17;
    deqp::gls::DrawTest::addIteration(test,&local_60,"index range = [0, 23]");
    local_60.indexMin = 0x17;
    local_60.indexMax = 0x28;
    deqp::gls::DrawTest::addIteration(test,&local_60,"index range = [23, 40]");
    if (local_60.primitive != PRIMITIVE_POINTS) goto LAB_0065f547;
    local_60.indexMin = 5;
    local_60.indexMax = 5;
    description = "index range = [5, 5]";
  }
  deqp::gls::DrawTest::addIteration(test,&local_60,description);
LAB_0065f547:
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_60.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else if (type == TYPE_INSTANCE_COUNT)
	{
		spec.instanceCount = 1;
		test->addIteration(spec, "instance count = 1");

		spec.instanceCount = 4;
		test->addIteration(spec, "instance count = 4");

		spec.instanceCount = 11;
		test->addIteration(spec, "instance count = 11");
	}
	else if (type == TYPE_INDEX_RANGE)
	{
		spec.indexMin = 0;
		spec.indexMax = 23;
		test->addIteration(spec, "index range = [0, 23]");

		spec.indexMin = 23;
		spec.indexMax = 40;
		test->addIteration(spec, "index range = [23, 40]");

		// Only makes sense with points
		if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_POINTS)
		{
			spec.indexMin = 5;
			spec.indexMax = 5;
			test->addIteration(spec, "index range = [5, 5]");
		}
	}
	else
		DE_ASSERT(false);
}